

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collector.cpp
# Opt level: O0

ssize_t __thiscall
jaegertracing::thrift::Collector_submitBatches_args::write
          (Collector_submitBatches_args *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  size_type sVar5;
  reference pBVar6;
  undefined4 in_register_00000034;
  TProtocol *prot;
  __normal_iterator<const_jaegertracing::thrift::Batch_*,_std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>_>
  local_50;
  Batch *local_48;
  __normal_iterator<const_jaegertracing::thrift::Batch_*,_std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>_>
  local_40;
  const_iterator _iter57;
  TOutputRecursionTracker local_28;
  TOutputRecursionTracker tracker;
  uint32_t xfer;
  TProtocol *oprot_local;
  Collector_submitBatches_args *this_local;
  
  prot = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  tracker.prot_._4_4_ = 0;
  apache::thrift::protocol::TOutputRecursionTracker::TOutputRecursionTracker(&local_28,prot);
  uVar2 = apache::thrift::protocol::TProtocol::writeStructBegin(prot,"Collector_submitBatches_args")
  ;
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldBegin(prot,"batches",T_LIST,1);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  sVar5 = std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>::
          size(&this->batches);
  uVar2 = apache::thrift::protocol::TProtocol::writeListBegin(prot,T_STRUCT,(uint32_t)sVar5);
  tracker.prot_._4_4_ = uVar2 + tracker.prot_._4_4_;
  __gnu_cxx::
  __normal_iterator<const_jaegertracing::thrift::Batch_*,_std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>_>
  ::__normal_iterator(&local_40);
  local_48 = (Batch *)std::
                      vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                      ::begin(&this->batches);
  local_40._M_current = local_48;
  while( true ) {
    local_50._M_current =
         (Batch *)std::
                  vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>
                  ::end(&this->batches);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_50);
    if (!bVar1) break;
    pBVar6 = __gnu_cxx::
             __normal_iterator<const_jaegertracing::thrift::Batch_*,_std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>_>
             ::operator*(&local_40);
    iVar3 = (**(code **)(*(long *)pBVar6 + 0x18))(pBVar6,prot);
    tracker.prot_._4_4_ = iVar3 + tracker.prot_._4_4_;
    __gnu_cxx::
    __normal_iterator<const_jaegertracing::thrift::Batch_*,_std::vector<jaegertracing::thrift::Batch,_std::allocator<jaegertracing::thrift::Batch>_>_>
    ::operator++(&local_40);
  }
  uVar2 = apache::thrift::protocol::TProtocol::writeListEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldEnd(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeFieldStop(prot);
  tracker.prot_._4_4_ = tracker.prot_._4_4_ + uVar2;
  uVar2 = apache::thrift::protocol::TProtocol::writeStructEnd(prot);
  uVar4 = uVar2 + tracker.prot_._4_4_;
  tracker.prot_._4_4_ = uVar4;
  apache::thrift::protocol::TOutputRecursionTracker::~TOutputRecursionTracker(&local_28);
  return (ulong)uVar4;
}

Assistant:

uint32_t Collector_submitBatches_args::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("Collector_submitBatches_args");

  xfer += oprot->writeFieldBegin("batches", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRUCT, static_cast<uint32_t>(this->batches.size()));
    std::vector<Batch> ::const_iterator _iter57;
    for (_iter57 = this->batches.begin(); _iter57 != this->batches.end(); ++_iter57)
    {
      xfer += (*_iter57).write(oprot);
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}